

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.h
# Opt level: O2

void __thiscall Clasp::mt::ParallelSolveOptions::ParallelSolveOptions(ParallelSolveOptions *this)

{
  *(undefined4 *)&(this->super_BasicSolveOptions).limit.conflicts = 0xffffffff;
  *(undefined4 *)((long)&(this->super_BasicSolveOptions).limit.conflicts + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_BasicSolveOptions).limit.restarts = 0xffffffff;
  *(undefined4 *)((long)&(this->super_BasicSolveOptions).limit.restarts + 4) = 0xffffffff;
  this->integrate = (Integration)0x10000400;
  (this->distribute).super_Policy = (Policy)0x0;
  (this->distribute).mode = 0;
  GRestarts::GRestarts(&this->restarts);
  (this->algorithm).threads = 1;
  (this->algorithm).mode = mode_compete;
  return;
}

Assistant:

ParallelSolveOptions() {}